

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O2

void server_cb(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_loop_t loop;
  uv_connect_t local_198;
  void *local_138;
  uv_pipe_t local_130;
  
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    iVar1 = uv_async_init(&loop,(uv_async_t *)((long)arg + 0x110),sv_async_cb);
    if (iVar1 == 0) {
      uv_unref((uv_handle_t *)((long)arg + 0x110));
      uv_sem_wait((uv_sem_t *)((long)arg + 0x198));
      *(char **)arg = "server handle";
      local_138 = arg;
      iVar1 = uv_pipe_init(&loop,&local_130,1);
      if (iVar1 == 0) {
        uv_pipe_connect(&local_198,&local_130,"/tmp/uv-test-sock",ipc_connect_cb);
        iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          uv_sem_post((uv_sem_t *)((long)arg + 0x198));
          iVar1 = uv_listen((uv_stream_t *)arg,0x80,sv_connection_cb);
          if (iVar1 == 0) {
            iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              uv_loop_close(&loop);
              return;
            }
            pcVar3 = "0 == uv_run(&loop, UV_RUN_DEFAULT)";
            uVar2 = 0x114;
          }
          else {
            pcVar3 = "0 == uv_listen((uv_stream_t*) &ctx->server_handle, 128, sv_connection_cb)";
            uVar2 = 0x113;
          }
        }
        else {
          pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
          uVar2 = 0xfd;
        }
      }
      else {
        pcVar3 = "0 == uv_pipe_init(loop, &ctx.ipc_pipe, 1)";
        uVar2 = 0xf8;
      }
    }
    else {
      pcVar3 = "0 == uv_async_init(&loop, &ctx->async_handle, sv_async_cb)";
      uVar2 = 0x108;
    }
  }
  else {
    pcVar3 = "0 == uv_loop_init(&loop)";
    uVar2 = 0x106;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void server_cb(void *arg) {
  struct server_ctx *ctx;
  uv_loop_t loop;

  ctx = arg;
  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_async_init(&loop, &ctx->async_handle, sv_async_cb));
  uv_unref((uv_handle_t*) &ctx->async_handle);

  /* Wait until the main thread is ready. */
  uv_sem_wait(&ctx->semaphore);
  get_listen_handle(&loop, (uv_stream_t*) &ctx->server_handle);
  uv_sem_post(&ctx->semaphore);

  /* Now start the actual benchmark. */
  ASSERT(0 == uv_listen((uv_stream_t*) &ctx->server_handle,
                        128,
                        sv_connection_cb));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  uv_loop_close(&loop);
}